

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bounding_box.cc
# Opt level: O2

void __thiscall draco::BoundingBox::BoundingBox(BoundingBox *this)

{
  Vector3f local_20;
  Vector3f local_10;
  
  local_10.v_._M_elems[0] = 3.4028235e+38;
  local_10.v_._M_elems[1] = 3.4028235e+38;
  local_10.v_._M_elems[2] = 3.4028235e+38;
  local_20.v_._M_elems[0] = -3.4028235e+38;
  local_20.v_._M_elems[1] = -3.4028235e+38;
  local_20.v_._M_elems[2] = -3.4028235e+38;
  BoundingBox(this,&local_10,&local_20);
  return;
}

Assistant:

BoundingBox::BoundingBox()
    : BoundingBox(Vector3f(std::numeric_limits<float>::max(),
                           std::numeric_limits<float>::max(),
                           std::numeric_limits<float>::max()),
                  Vector3f(std::numeric_limits<float>::lowest(),
                           std::numeric_limits<float>::lowest(),
                           std::numeric_limits<float>::lowest())) {}